

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O0

void * xmlHashLookup3(xmlHashTablePtr hash,xmlChar *key,xmlChar *key2,xmlChar *key3)

{
  xmlHashEntry *pxVar1;
  int local_40;
  uint local_3c;
  int found;
  uint hashValue;
  xmlHashEntry *entry;
  xmlChar *key3_local;
  xmlChar *key2_local;
  xmlChar *key_local;
  xmlHashTablePtr hash_local;
  
  if (((hash == (xmlHashTablePtr)0x0) || (hash->size == 0)) || (key == (xmlChar *)0x0)) {
    hash_local = (xmlHashTablePtr)0x0;
  }
  else {
    entry = (xmlHashEntry *)key3;
    key3_local = key2;
    key2_local = key;
    key_local = (xmlChar *)hash;
    local_3c = xmlHashValue(hash->randomSeed,key,key2,key3,(size_t *)0x0);
    pxVar1 = xmlHashFindEntry((xmlHashTable *)key_local,key2_local,key3_local,(xmlChar *)entry,
                              local_3c,&local_40);
    if (local_40 == 0) {
      hash_local = (xmlHashTablePtr)0x0;
    }
    else {
      hash_local = (xmlHashTablePtr)pxVar1->payload;
    }
  }
  return hash_local;
}

Assistant:

void *
xmlHashLookup3(xmlHashTablePtr hash, const xmlChar *key,
               const xmlChar *key2, const xmlChar *key3) {
    const xmlHashEntry *entry;
    unsigned hashValue;
    int found;

    if ((hash == NULL) || (hash->size == 0) || (key == NULL))
        return(NULL);
    hashValue = xmlHashValue(hash->randomSeed, key, key2, key3, NULL);
    entry = xmlHashFindEntry(hash, key, key2, key3, hashValue, &found);
    if (found)
        return(entry->payload);
    return(NULL);
}